

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDVertex::MarkedEdgeCount(ON_SubDVertex *this)

{
  bool bVar1;
  ulong uVar2;
  ON_SubDEdge *e;
  unsigned_short vei;
  uint mark_count;
  ON_SubDVertex *this_local;
  
  e._4_4_ = 0;
  for (e._2_2_ = 0; e._2_2_ < this->m_edge_count; e._2_2_ = e._2_2_ + 1) {
    uVar2 = this->m_edges[e._2_2_].m_ptr & 0xfffffffffffffff8;
    if ((uVar2 != 0) &&
       (bVar1 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(uVar2 + 0x10)), bVar1)) {
      e._4_4_ = e._4_4_ + 1;
    }
  }
  return e._4_4_;
}

Assistant:

unsigned int ON_SubDVertex::MarkedEdgeCount() const
{
  unsigned int mark_count = 0;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr != e && e->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}